

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s,int position)

{
  BrotliBitReader *br;
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  byte *pbVar5;
  byte *pbVar6;
  HuffmanCode **ppHVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  HuffmanCode *pHVar12;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  uint local_48;
  uint local_44;
  HuffmanCode *local_40;
  size_t local_38;
  
  uVar2 = s->num_block_types[0];
  if (uVar2 < 2) {
LAB_00106170:
    iVar14 = 0;
  }
  else {
    pHVar12 = s->block_type_trees;
    local_40 = s->block_len_trees;
    br = &s->br;
    uVar4 = (s->br).val_;
    uVar3 = (s->br).bit_pos_;
    pbVar5 = (s->br).next_in;
    local_38 = (s->br).avail_in;
    iVar10 = 0;
    iVar14 = -8;
    iVar16 = -0x32;
    uVar9 = uVar4;
    pbVar6 = pbVar5;
    sVar11 = local_38;
    while( true ) {
      sVar11 = sVar11 - 1;
      if (0xe < uVar3 + iVar16) break;
      if (sVar11 == 0xffffffffffffffff) {
        iVar14 = SafeDecodeSymbol(pHVar12,br,&local_48);
        if (iVar14 == 0) goto LAB_00106170;
        goto LAB_00105fc6;
      }
      (s->br).val_ = uVar9 >> 8;
      uVar9 = uVar9 >> 8 | (ulong)*pbVar6 << 0x38;
      (s->br).val_ = uVar9;
      (s->br).bit_pos_ = uVar3 + iVar14;
      (s->br).avail_in = sVar11;
      (s->br).next_in = pbVar6 + 1;
      iVar10 = iVar10 + 8;
      iVar14 = iVar14 + -8;
      iVar16 = iVar16 + -8;
      pbVar6 = pbVar6 + 1;
    }
    iVar14 = uVar3 - iVar10;
    uVar9 = uVar9 >> ((byte)iVar14 & 0x3f);
    pHVar12 = pHVar12 + (uVar9 & 0xff);
    uVar8 = (uint)pHVar12->bits;
    if (8 < uVar8) {
      iVar14 = (uVar3 - iVar10) + 8;
      pHVar12 = pHVar12 + (((uint)(uVar9 >> 8) & 0xffffff & kBitMask[pHVar12->bits - 8] & 0x7f) +
                          (uint)pHVar12->value);
      uVar8 = (uint)pHVar12->bits;
    }
    (s->br).bit_pos_ = uVar8 + iVar14;
    local_48 = (uint)pHVar12->value;
LAB_00105fc6:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      for (uVar8 = (s->br).bit_pos_ - 0x32; uVar8 < 0xf; uVar8 = uVar8 - 8) {
        sVar11 = (s->br).avail_in;
        if (sVar11 == 0) {
          iVar14 = SafeDecodeSymbol(local_40,br,&local_44);
          if (iVar14 != 0) goto LAB_001060a2;
          goto LAB_00106154;
        }
        uVar9 = (s->br).val_;
        pbVar6 = (s->br).next_in;
        (s->br).val_ = uVar9 >> 8;
        (s->br).val_ = (ulong)*pbVar6 << 0x38 | uVar9 >> 8;
        (s->br).bit_pos_ = uVar8 + 0x2a;
        (s->br).avail_in = sVar11 - 1;
        (s->br).next_in = pbVar6 + 1;
      }
      iVar14 = uVar8 + 0x32;
      uVar9 = br->val_ >> ((byte)iVar14 & 0x3f);
      local_40 = local_40 + (uVar9 & 0xff);
      uVar13 = (uint)local_40->bits;
      if (8 < uVar13) {
        iVar14 = uVar8 + 0x3a;
        local_40 = local_40 +
                   (((uint)(uVar9 >> 8) & 0xffffff & kBitMask[local_40->bits - 8] & 0x7f) +
                   (uint)local_40->value);
        uVar13 = (uint)local_40->bits;
      }
      (s->br).bit_pos_ = uVar13 + iVar14;
      local_44 = (uint)local_40->value;
    }
    else {
      local_44 = s->block_length_index;
    }
LAB_001060a2:
    bVar1 = kBlockLengthPrefixCode[local_44].nbits;
    uVar15 = (s->br).bit_pos_;
    iVar14 = -uVar15;
LAB_001060b9:
    uVar15 = uVar15 - 8;
    if (iVar14 + 0x40U < (uint)bVar1) {
      sVar11 = (s->br).avail_in;
      if (sVar11 != 0) goto code_r0x001060cf;
      s->block_length_index = local_44;
LAB_00106154:
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      (s->br).val_ = uVar4;
      (s->br).bit_pos_ = uVar3;
      (s->br).next_in = pbVar5;
      (s->br).avail_in = local_38;
      goto LAB_00106170;
    }
    uVar8 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = (uint)bVar1 - iVar14;
    s->block_length[0] =
         (uint)kBlockLengthPrefixCode[local_44].offset +
         ((uint)((s->br).val_ >> (-(char)iVar14 & 0x3fU)) & uVar8);
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_48 == 0) {
      local_48 = s->block_type_rb[0];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[1] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    uVar8 = 0;
    if (uVar2 <= local_48) {
      uVar8 = uVar2;
    }
    local_48 = local_48 - uVar8;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_48;
    if ((s->field_0x338 & 0x40) != 0) {
      if (s->saved_position_literals_begin == 0) {
        sVar11 = (s->literals_block_splits).num_blocks;
      }
      else {
        sVar11 = (s->literals_block_splits).num_blocks;
        (s->literals_block_splits).positions_end[sVar11] = position;
        sVar11 = sVar11 + 1;
        (s->literals_block_splits).num_blocks = sVar11;
      }
      (s->literals_block_splits).positions_begin[sVar11] = position;
      (s->literals_block_splits).types[sVar11] =
           (char)(int)(s->literals_block_splits).num_types_prev_metablocks +
           (char)s->block_type_rb[1];
      uVar4 = (s->literals_block_splits).num_types;
      uVar9 = (ulong)(s->literals_block_splits).types[(s->literals_block_splits).num_blocks] + 1;
      if (uVar9 < uVar4) {
        uVar9 = uVar4;
      }
      (s->literals_block_splits).num_types = uVar9;
      local_48 = s->block_type_rb[1];
    }
    ppHVar7 = (s->literal_hgroup).htrees;
    s->context_map_slice = s->context_map + (local_48 << 6);
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_48 >> 5] >> (local_48 & 0x1f) & 1) != 0);
    s->literal_htree = ppHVar7[s->context_map[local_48 << 6]];
    s->context_lookup = "" + ((s->context_modes[local_48] & 3) << 9);
    iVar14 = 1;
  }
  return iVar14;
code_r0x001060cf:
  uVar9 = (s->br).val_;
  pbVar6 = (s->br).next_in;
  (s->br).val_ = uVar9 >> 8;
  (s->br).val_ = (ulong)*pbVar6 << 0x38 | uVar9 >> 8;
  (s->br).bit_pos_ = uVar15;
  (s->br).avail_in = sVar11 - 1;
  (s->br).next_in = pbVar6 + 1;
  iVar14 = iVar14 + 8;
  goto LAB_001060b9;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeLiteralBlockSwitch(
    BrotliDecoderState* s, int position) {
  return DecodeLiteralBlockSwitchInternal(1, s, position);
}